

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::
     format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
               (ostream *out,char *fmt,basic_string_view<char,_std::char_traits<char>_> *args,
               basic_string_view<char,_std::char_traits<char>_> *args_1,int *args_2,
               basic_string_view<char,_std::char_traits<char>_> *args_3,char (*args_4) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               char (*args_6) [42])

{
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  char (*in_RSI) [13];
  ostream *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  FormatListRef in_stack_00000010;
  char *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char (*in_stack_ffffffffffffff48) [42];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
            (in_RCX,in_R8,in_R9,
             (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff40,in_RSI,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  vformat(in_RDI,in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}